

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void AccessibleCompatible(TidyDocImpl *doc,Node *node)

{
  Dict *pDVar1;
  uint code;
  bool bVar2;
  
  if (0xfffffffc < (doc->access).PRIORITYCHK - 4U) {
    pDVar1 = node->tag;
    if (pDVar1 == (Dict *)0x0) {
      bVar2 = true;
      code = 0;
    }
    else {
      bVar2 = pDVar1->id != TidyTag_SCRIPT;
      code = 0x2e7;
      if (bVar2) {
        code = 0;
      }
      if (bVar2 && pDVar1 != (Dict *)0x0) {
        bVar2 = pDVar1->id != TidyTag_OBJECT;
        code = 0;
        if (!bVar2) {
          code = 0x2e8;
        }
        if (bVar2 && pDVar1 != (Dict *)0x0) {
          bVar2 = pDVar1->id != TidyTag_EMBED;
          code = 0x2ea;
          if (bVar2) {
            code = 0;
          }
          if (bVar2 && pDVar1 != (Dict *)0x0) {
            bVar2 = pDVar1->id != TidyTag_APPLET;
            code = 0x2e9;
            if (bVar2) {
              code = 0;
            }
          }
        }
      }
    }
    if (!bVar2) {
      prvTidyReport(doc,(Node *)0x0,node,code);
      return;
    }
  }
  return;
}

Assistant:

static void AccessibleCompatible( TidyDocImpl* doc, Node* node )
{
    if (Level1_Enabled( doc ))
    {
        int msgcode = 0;
        if ( nodeIsSCRIPT(node) )
            msgcode = ENSURE_PROGRAMMATIC_OBJECTS_ACCESSIBLE_SCRIPT;
        else if ( nodeIsOBJECT(node) )
            msgcode = ENSURE_PROGRAMMATIC_OBJECTS_ACCESSIBLE_OBJECT;
        else if ( nodeIsEMBED(node) )
            msgcode = ENSURE_PROGRAMMATIC_OBJECTS_ACCESSIBLE_EMBED;
        else if ( nodeIsAPPLET(node) )
            msgcode = ENSURE_PROGRAMMATIC_OBJECTS_ACCESSIBLE_APPLET;

        if ( msgcode )
            TY_(ReportAccessError)( doc, node, msgcode );
    }
}